

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O0

timestamp_t duckdb::Interval::Add(timestamp_t left,interval_t right)

{
  interval_t right_00;
  dtime_t time_00;
  bool bVar1;
  date_t *in_RDX;
  dtime_t *in_RSI;
  int64_t in_RDI;
  dtime_t new_time;
  date_t new_date;
  dtime_t time;
  date_t date;
  date_t in_stack_00000060;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  timestamp_t in_stack_ffffffffffffff90;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  date_t date_00;
  undefined8 local_8;
  
  local_8 = in_RDI;
  bVar1 = Timestamp::IsFinite(in_stack_ffffffffffffff90);
  date_00.days = (int32_t)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    Timestamp::Convert(local_8,in_RDX,in_RSI);
    Add(in_stack_00000060,(interval_t)_time);
    right_00.micros = (int64_t)in_RDX;
    right_00._0_8_ = in_RSI;
    Add(local_38,right_00,(date_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    time_00.micros._4_4_ = in_stack_ffffffffffffffd4;
    time_00.micros._0_4_ = in_stack_ffffffffffffffd0;
    local_8 = Timestamp::FromDatetime(date_00,time_00);
  }
  return (timestamp_t)local_8;
}

Assistant:

timestamp_t Interval::Add(timestamp_t left, interval_t right) {
	if (!Timestamp::IsFinite(left)) {
		return left;
	}
	date_t date;
	dtime_t time;
	Timestamp::Convert(left, date, time);
	auto new_date = Interval::Add(date, right);
	auto new_time = Interval::Add(time, right, new_date);
	return Timestamp::FromDatetime(new_date, new_time);
}